

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

String * Rml::ComputeFontFamily(String *__return_storage_ptr__,String *font_family)

{
  String local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)font_family);
  StringUtilities::ToLower(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

String ComputeFontFamily(String font_family)
{
	return StringUtilities::ToLower(std::move(font_family));
}